

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O1

void __thiscall
Disa::Adjacency_Graph<false>::Adjacency_Graph
          (Adjacency_Graph<false> *this,
          initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph)

{
  Edge *pEVar1;
  Edge *pEVar2;
  ulong uVar3;
  Edge *pEVar4;
  Edge *edge;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  const_iterator __begin2;
  
  uVar3 = edge_graph._M_len;
  edge = edge_graph._M_array;
  uVar7 = uVar3 * 0x10;
  (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar4 = edge;
  if (1 < uVar3) {
    pEVar2 = edge + 1;
    do {
      uVar5 = pEVar4->second;
      if (pEVar4->second < pEVar4->first) {
        uVar5 = pEVar4->first;
      }
      uVar6 = pEVar2->second;
      if (pEVar2->second < pEVar2->first) {
        uVar6 = pEVar2->first;
      }
      pEVar1 = pEVar2;
      if (uVar6 <= uVar5) {
        pEVar1 = pEVar4;
      }
      pEVar4 = pEVar1;
      pEVar2 = pEVar2 + 1;
    } while (pEVar2 != edge + uVar3);
  }
  uVar5 = pEVar4->second;
  if (pEVar4->second < pEVar4->first) {
    uVar5 = pEVar4->first;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&this->offset,uVar5 + 1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->vertex_adjacent_list,uVar3 * 2);
  while (uVar3 != 0) {
    insert(this,edge);
    edge = edge + 1;
    uVar7 = uVar7 - 0x10;
    uVar3 = uVar7;
  }
  if ((this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
    _S_do_it(&this->vertex_adjacent_list);
  }
  if ((this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage ==
      (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
  _S_do_it(&this->offset);
  return;
}

Assistant:

Adjacency_Graph<_directed>::Adjacency_Graph(std::initializer_list<Edge> edge_graph) {
  const auto iter = std::max_element(edge_graph.begin(), edge_graph.end(),
                                     !_directed ?
                                      [](const Edge& edge_0, const Edge& edge_1) {
                                          return order_edge_vertex(&edge_0).second < order_edge_vertex(&edge_1).second;
                                        } :
                                      [](const Edge& edge_0, const Edge& edge_1) {
                                          return edge_0.second < edge_1.second;
                                        });
  reserve(!_directed ? std::max(iter->first, iter->second) : iter->first, edge_graph.size());
  FOR_EACH(edge, edge_graph) insert(edge);
  shrink_to_fit();
}